

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_line_progressed(Parser *this,size_t ahead)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  error_flags eVar4;
  ulong in_RSI;
  long in_RDI;
  char msg [74];
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  Location *in_stack_ffffffffffffff00;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  undefined1 local_98 [88];
  ulong local_40;
  char *local_30;
  undefined4 local_28;
  ulong local_20;
  long local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30) =
       in_RSI + *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30);
  *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x40) =
       in_RSI + *(long *)(*(long *)(in_RDI + 0x9f0) + 0x40);
  local_40 = in_RSI;
  if (*(long *)(*(long *)(in_RDI + 0x9f0) + 0x70) + 1U <
      *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x40)) {
    memcpy(local_98,"check failed: (m_state->pos.col <= m_state->line_contents.stripped.len+1)",0x4a
          );
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    (*pcVar1)(local_98,0x4a,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffef0 = uStack_a8;
    in_stack_fffffffffffffef4 = uStack_a4;
    in_stack_fffffffffffffef8 = local_a0;
  }
  local_18 = *(long *)(in_RDI + 0x9f0) + 0x78;
  local_20 = local_40;
  if (*(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x80) < local_40) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x1533;
    handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            ((basic_substring<const_char> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  lVar2 = *(long *)(in_RDI + 0x9f0);
  *(undefined8 *)(lVar2 + 0x78) = local_10;
  *(undefined8 *)(lVar2 + 0x80) = local_8;
  return;
}

Assistant:

void Parser::_line_progressed(size_t ahead)
{
    _c4dbgpf("line[{}] ({} cols) progressed by {}:  col {}-->{}   offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, ahead, m_state->pos.col, m_state->pos.col+ahead, m_state->pos.offset, m_state->pos.offset+ahead);
    m_state->pos.offset += ahead;
    m_state->pos.col += ahead;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col <= m_state->line_contents.stripped.len+1);
    m_state->line_contents.rem = m_state->line_contents.rem.sub(ahead);
}